

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void ConvertBGR24ToY_SSE2(uint8_t *bgr,uint8_t *y,int width)

{
  uint8_t *puVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  unkuint9 Var53;
  undefined1 auVar54 [11];
  undefined1 auVar55 [15];
  unkuint9 Var56;
  undefined1 auVar57 [11];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  unkuint9 Var60;
  undefined1 auVar61 [11];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  bool bVar71;
  long lVar72;
  byte *pbVar73;
  ulong uVar74;
  uint uVar75;
  ulong uVar76;
  bool bVar77;
  __m128i *palVar78;
  byte bVar79;
  undefined1 uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  unkint10 Var84;
  undefined1 auVar85 [16];
  undefined2 uVar86;
  undefined2 uVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  uint8_t local_78;
  uint8_t uStack_77;
  uint8_t uStack_76;
  uint8_t uStack_75;
  uint8_t uStack_74;
  uint8_t uStack_73;
  uint8_t uStack_72;
  uint8_t uStack_71;
  uint8_t uStack_70;
  uint8_t uStack_6f;
  uint8_t uStack_6e;
  uint8_t uStack_6d;
  uint8_t uStack_6c;
  uint8_t uStack_6b;
  uint8_t uStack_6a;
  uint8_t uStack_69;
  __m128i bgr_plane [6];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  
  auVar70 = _DAT_0012cea0;
  auVar69 = _DAT_0012ce90;
  if ((int)(width & 0xffffffe0U) < 1) {
    uVar75 = 0;
  }
  else {
    uVar74 = 0;
    do {
      local_78 = *bgr;
      uStack_77 = bgr[3];
      uStack_76 = bgr[6];
      uStack_75 = bgr[9];
      uStack_74 = bgr[0xc];
      uStack_73 = bgr[0xf];
      uStack_72 = bgr[0x12];
      uStack_71 = bgr[0x15];
      uStack_70 = bgr[0x18];
      uStack_6f = bgr[0x1b];
      uStack_6e = bgr[0x1e];
      uStack_6d = bgr[0x21];
      uStack_6c = bgr[0x24];
      uStack_6b = bgr[0x27];
      uStack_6a = bgr[0x2a];
      uStack_69 = bgr[0x2d];
      bgr_plane[0][0]._0_1_ = bgr[0x30];
      bgr_plane[0][0]._1_1_ = bgr[0x33];
      bgr_plane[0][0]._2_1_ = bgr[0x36];
      bgr_plane[0][0]._3_1_ = bgr[0x39];
      bgr_plane[0][0]._4_1_ = bgr[0x3c];
      bgr_plane[0][0]._5_1_ = bgr[0x3f];
      bgr_plane[0][0]._6_1_ = bgr[0x42];
      bgr_plane[0][0]._7_1_ = bgr[0x45];
      bgr_plane[0][1]._0_1_ = bgr[0x48];
      bgr_plane[0][1]._1_1_ = bgr[0x4b];
      bgr_plane[0][1]._2_1_ = bgr[0x4e];
      bgr_plane[0][1]._3_1_ = bgr[0x51];
      bgr_plane[0][1]._4_1_ = bgr[0x54];
      bgr_plane[0][1]._5_1_ = bgr[0x57];
      bgr_plane[0][1]._6_1_ = bgr[0x5a];
      bgr_plane[0][1]._7_1_ = bgr[0x5d];
      bgr_plane[1][0]._0_1_ = bgr[1];
      bgr_plane[1][0]._1_1_ = bgr[4];
      bgr_plane[1][0]._2_1_ = bgr[7];
      bgr_plane[1][0]._3_1_ = bgr[10];
      bgr_plane[1][0]._4_1_ = bgr[0xd];
      bgr_plane[1][0]._5_1_ = bgr[0x10];
      bgr_plane[1][0]._6_1_ = bgr[0x13];
      bgr_plane[1][0]._7_1_ = bgr[0x16];
      bgr_plane[1][1]._0_1_ = bgr[0x19];
      bgr_plane[1][1]._1_1_ = bgr[0x1c];
      bgr_plane[1][1]._2_1_ = bgr[0x1f];
      bgr_plane[1][1]._3_1_ = bgr[0x22];
      bgr_plane[1][1]._4_1_ = bgr[0x25];
      bgr_plane[1][1]._5_1_ = bgr[0x28];
      bgr_plane[1][1]._6_1_ = bgr[0x2b];
      bgr_plane[1][1]._7_1_ = bgr[0x2e];
      bgr_plane[2][0]._0_1_ = bgr[0x31];
      bgr_plane[2][0]._1_1_ = bgr[0x34];
      bgr_plane[2][0]._2_1_ = bgr[0x37];
      bgr_plane[2][0]._3_1_ = bgr[0x3a];
      bgr_plane[2][0]._4_1_ = bgr[0x3d];
      bgr_plane[2][0]._5_1_ = bgr[0x40];
      bgr_plane[2][0]._6_1_ = bgr[0x43];
      bgr_plane[2][0]._7_1_ = bgr[0x46];
      bgr_plane[2][1]._0_1_ = bgr[0x49];
      bgr_plane[2][1]._1_1_ = bgr[0x4c];
      bgr_plane[2][1]._2_1_ = bgr[0x4f];
      bgr_plane[2][1]._3_1_ = bgr[0x52];
      bgr_plane[2][1]._4_1_ = bgr[0x55];
      bgr_plane[2][1]._5_1_ = bgr[0x58];
      bgr_plane[2][1]._6_1_ = bgr[0x5b];
      bgr_plane[2][1]._7_1_ = bgr[0x5e];
      bgr_plane[3][0]._0_1_ = bgr[2];
      bgr_plane[3][0]._1_1_ = bgr[5];
      bgr_plane[3][0]._2_1_ = bgr[8];
      bgr_plane[3][0]._3_1_ = bgr[0xb];
      bgr_plane[3][0]._4_1_ = bgr[0xe];
      bgr_plane[3][0]._5_1_ = bgr[0x11];
      bgr_plane[3][0]._6_1_ = bgr[0x14];
      bgr_plane[3][0]._7_1_ = bgr[0x17];
      bgr_plane[3][1]._0_1_ = bgr[0x1a];
      bgr_plane[3][1]._1_1_ = bgr[0x1d];
      bgr_plane[3][1]._2_1_ = bgr[0x20];
      bgr_plane[3][1]._3_1_ = bgr[0x23];
      bgr_plane[3][1]._4_1_ = bgr[0x26];
      bgr_plane[3][1]._5_1_ = bgr[0x29];
      bgr_plane[3][1]._6_1_ = bgr[0x2c];
      bgr_plane[3][1]._7_1_ = bgr[0x2f];
      bgr_plane[4][0]._0_1_ = bgr[0x32];
      bgr_plane[4][0]._1_1_ = bgr[0x35];
      bgr_plane[4][0]._2_1_ = bgr[0x38];
      bgr_plane[4][0]._3_1_ = bgr[0x3b];
      bgr_plane[4][0]._4_1_ = bgr[0x3e];
      bgr_plane[4][0]._5_1_ = bgr[0x41];
      bgr_plane[4][0]._6_1_ = bgr[0x44];
      bgr_plane[4][0]._7_1_ = bgr[0x47];
      bgr_plane[4][1]._0_1_ = bgr[0x4a];
      bgr_plane[4][1]._1_1_ = bgr[0x4d];
      bgr_plane[4][1]._2_1_ = bgr[0x50];
      bgr_plane[4][1]._3_1_ = bgr[0x53];
      bgr_plane[4][1]._4_1_ = bgr[0x56];
      bgr_plane[4][1]._5_1_ = bgr[0x59];
      bgr_plane[4][1]._6_1_ = bgr[0x5c];
      bgr_plane[4][1]._7_1_ = bgr[0x5f];
      uVar76 = uVar74 & 0xffffffff;
      uVar74 = (ulong)(int)uVar74;
      lVar72 = 0;
      palVar78 = (__m128i *)&local_78;
      bVar71 = true;
      do {
        bVar77 = bVar71;
        alVar2 = *palVar78;
        auVar21[0xd] = 0;
        auVar21._0_13_ = alVar2._0_13_;
        auVar21[0xe] = alVar2[0]._7_1_;
        auVar24[0xc] = alVar2[0]._6_1_;
        auVar24._0_12_ = alVar2._0_12_;
        auVar24._13_2_ = auVar21._13_2_;
        auVar27[0xb] = 0;
        auVar27._0_11_ = alVar2._0_11_;
        auVar27._12_3_ = auVar24._12_3_;
        auVar30[10] = alVar2[0]._5_1_;
        auVar30._0_10_ = alVar2._0_10_;
        auVar30._11_4_ = auVar27._11_4_;
        auVar35[9] = 0;
        auVar35._0_9_ = alVar2._0_9_;
        auVar35._10_5_ = auVar30._10_5_;
        auVar40[8] = alVar2[0]._4_1_;
        auVar40._0_8_ = alVar2[0];
        auVar40._9_6_ = auVar35._9_6_;
        auVar52._7_8_ = 0;
        auVar52._0_7_ = auVar40._8_7_;
        Var53 = CONCAT81(SUB158(auVar52 << 0x40,7),alVar2[0]._3_1_);
        auVar63._9_6_ = 0;
        auVar63._0_9_ = Var53;
        auVar54._1_10_ = SUB1510(auVar63 << 0x30,5);
        auVar54[0] = alVar2[0]._2_1_;
        auVar64._11_4_ = 0;
        auVar64._0_11_ = auVar54;
        auVar49[2] = alVar2[0]._1_1_;
        auVar49._0_2_ = (short)alVar2[0];
        auVar49._3_12_ = SUB1512(auVar64 << 0x20,3);
        alVar3 = bgr_plane[lVar72 + 1];
        alVar4 = bgr_plane[lVar72 + 3];
        uVar80 = alVar3[0]._7_1_;
        auVar22[0xd] = 0;
        auVar22._0_13_ = alVar3._0_13_;
        auVar22[0xe] = uVar80;
        auVar25[0xc] = alVar3[0]._6_1_;
        auVar25._0_12_ = alVar3._0_12_;
        auVar25._13_2_ = auVar22._13_2_;
        auVar28[0xb] = 0;
        auVar28._0_11_ = alVar3._0_11_;
        auVar28._12_3_ = auVar25._12_3_;
        auVar31[10] = alVar3[0]._5_1_;
        auVar31._0_10_ = alVar3._0_10_;
        auVar31._11_4_ = auVar28._11_4_;
        auVar36[9] = 0;
        auVar36._0_9_ = alVar3._0_9_;
        auVar36._10_5_ = auVar31._10_5_;
        auVar41[8] = alVar3[0]._4_1_;
        auVar41._0_8_ = alVar3[0];
        auVar41._9_6_ = auVar36._9_6_;
        auVar55._7_8_ = 0;
        auVar55._0_7_ = auVar41._8_7_;
        Var56 = CONCAT81(SUB158(auVar55 << 0x40,7),alVar3[0]._3_1_);
        auVar65._9_6_ = 0;
        auVar65._0_9_ = Var56;
        auVar57._1_10_ = SUB1510(auVar65 << 0x30,5);
        auVar57[0] = alVar3[0]._2_1_;
        auVar66._11_4_ = 0;
        auVar66._0_11_ = auVar57;
        uVar86 = (undefined2)alVar3[0];
        auVar50[2] = alVar3[0]._1_1_;
        auVar50._0_2_ = uVar86;
        auVar50._3_12_ = SUB1512(auVar66 << 0x20,3);
        auVar58._13_2_ = 0;
        auVar58._0_13_ = auVar50._2_13_;
        auVar23[0xd] = 0;
        auVar23._0_13_ = alVar4._0_13_;
        auVar23[0xe] = alVar4[0]._7_1_;
        auVar26[0xc] = alVar4[0]._6_1_;
        auVar26._0_12_ = alVar4._0_12_;
        auVar26._13_2_ = auVar23._13_2_;
        auVar29[0xb] = 0;
        auVar29._0_11_ = alVar4._0_11_;
        auVar29._12_3_ = auVar26._12_3_;
        auVar32[10] = alVar4[0]._5_1_;
        auVar32._0_10_ = alVar4._0_10_;
        auVar32._11_4_ = auVar29._11_4_;
        auVar37[9] = 0;
        auVar37._0_9_ = alVar4._0_9_;
        auVar37._10_5_ = auVar32._10_5_;
        auVar42[8] = alVar4[0]._4_1_;
        auVar42._0_8_ = alVar4[0];
        auVar42._9_6_ = auVar37._9_6_;
        auVar59._7_8_ = 0;
        auVar59._0_7_ = auVar42._8_7_;
        Var60 = CONCAT81(SUB158(auVar59 << 0x40,7),alVar4[0]._3_1_);
        auVar67._9_6_ = 0;
        auVar67._0_9_ = Var60;
        auVar61._1_10_ = SUB1510(auVar67 << 0x30,5);
        auVar61[0] = alVar4[0]._2_1_;
        auVar68._11_4_ = 0;
        auVar68._0_11_ = auVar61;
        auVar51[2] = alVar4[0]._1_1_;
        auVar51._0_2_ = (short)alVar4[0];
        auVar51._3_12_ = SUB1512(auVar68 << 0x20,3);
        auVar62._13_2_ = 0;
        auVar62._0_13_ = auVar51._2_13_;
        uVar91 = (undefined2)Var56;
        auVar98._0_12_ = SUB1512(auVar62 << 0x10,0);
        auVar98._12_2_ = (short)Var60;
        auVar98._14_2_ = uVar91;
        auVar97._12_4_ = auVar98._12_4_;
        auVar97._0_10_ = SUB1510(auVar62 << 0x10,0);
        auVar97._10_2_ = auVar57._0_2_;
        auVar96._10_6_ = auVar97._10_6_;
        auVar96._8_2_ = auVar61._0_2_;
        auVar96._6_2_ = auVar50._2_2_;
        auVar96._4_2_ = auVar51._2_2_;
        auVar96._0_4_ = CONCAT22(uVar86,(short)alVar4[0]) & 0xff00ff;
        auVar94._2_2_ = auVar41._8_2_;
        auVar94._0_2_ = auVar42._8_2_;
        auVar94._4_2_ = auVar32._10_2_;
        auVar94._6_2_ = auVar31._10_2_;
        auVar94._8_2_ = auVar26._12_2_;
        auVar94._10_2_ = auVar25._12_2_;
        auVar94[0xc] = alVar4[0]._7_1_;
        auVar94[0xd] = 0;
        auVar94[0xe] = uVar80;
        auVar94[0xf] = 0;
        auVar99._0_12_ = SUB1512(auVar58 << 0x10,0);
        auVar99._12_2_ = uVar91;
        auVar99._14_2_ = (short)Var53;
        auVar95._12_4_ = auVar99._12_4_;
        auVar95._0_10_ = SUB1510(auVar58 << 0x10,0);
        auVar95._10_2_ = auVar54._0_2_;
        auVar83._10_6_ = auVar95._10_6_;
        auVar83._8_2_ = auVar57._0_2_;
        auVar83._6_2_ = auVar49._2_2_;
        auVar83._4_2_ = auVar50._2_2_;
        auVar83._0_4_ = CONCAT22((short)alVar2[0],uVar86) & 0xff00ff;
        auVar87._2_2_ = auVar40._8_2_;
        auVar87._0_2_ = auVar41._8_2_;
        auVar87._4_2_ = auVar31._10_2_;
        auVar87._6_2_ = auVar30._10_2_;
        auVar87._8_2_ = auVar25._12_2_;
        auVar87._10_2_ = auVar24._12_2_;
        auVar87[0xc] = uVar80;
        auVar87[0xd] = 0;
        auVar87[0xe] = alVar2[0]._7_1_;
        auVar87[0xf] = 0;
        auVar99 = pmaddwd(auVar96,auVar69);
        auVar95 = pmaddwd(auVar94,auVar69);
        auVar81 = pmaddwd(auVar83,auVar70);
        auVar88 = pmaddwd(auVar87,auVar70);
        auVar82._0_4_ = auVar81._0_4_ + auVar99._0_4_ + 0x108000U >> 0x10;
        auVar82._4_4_ = auVar81._4_4_ + auVar99._4_4_ + 0x108000U >> 0x10;
        auVar82._8_4_ = auVar81._8_4_ + auVar99._8_4_ + 0x108000U >> 0x10;
        auVar82._12_4_ = auVar81._12_4_ + auVar99._12_4_ + 0x108000U >> 0x10;
        auVar89._0_4_ = auVar88._0_4_ + auVar95._0_4_ + 0x108000U >> 0x10;
        auVar89._4_4_ = auVar88._4_4_ + auVar95._4_4_ + 0x108000U >> 0x10;
        auVar89._8_4_ = auVar88._8_4_ + auVar95._8_4_ + 0x108000U >> 0x10;
        auVar89._12_4_ = auVar88._12_4_ + auVar95._12_4_ + 0x108000U >> 0x10;
        auVar83 = packssdw(auVar82,auVar89);
        auVar92[1] = 0;
        auVar92[0] = (byte)alVar3[1];
        bVar79 = alVar3[1]._4_1_;
        uVar80 = alVar3[1]._5_1_;
        auVar34[10] = uVar80;
        auVar34._0_10_ = (unkuint10)bVar79 << 0x40;
        auVar34[0xb] = 0;
        auVar90[1] = 0;
        auVar90[0] = (byte)alVar4[1];
        Var84 = (unkuint10)alVar4[1]._4_1_ << 0x40;
        auVar33[10] = alVar4[1]._5_1_;
        auVar33._0_10_ = Var84;
        auVar33[0xb] = 0;
        auVar33[0xc] = alVar4[1]._3_1_;
        auVar33[0xd] = 0;
        auVar33[0xe] = alVar3[1]._3_1_;
        auVar38[10] = alVar3[1]._2_1_;
        auVar38._0_10_ = Var84;
        auVar38[0xb] = 0;
        auVar38._12_3_ = auVar33._12_3_;
        auVar43._10_5_ = auVar38._10_5_;
        auVar43._0_10_ = (unkuint10)alVar4[1]._2_1_ << 0x40;
        auVar45._8_7_ = auVar43._8_7_;
        auVar45._0_8_ = (ulong)alVar3[1]._1_1_ << 0x30;
        auVar47._6_9_ = auVar45._6_9_;
        auVar47._0_6_ = (uint6)alVar4[1]._1_1_ << 0x20;
        auVar90[2] = (byte)alVar3[1];
        auVar90[3] = 0;
        auVar90._4_11_ = auVar47._4_11_;
        auVar90[0xf] = 0;
        auVar85[1] = 0;
        auVar85[0] = alVar4[1]._4_1_;
        auVar81[1] = 0;
        auVar81[0] = bVar79;
        auVar85[2] = bVar79;
        auVar85[3] = 0;
        auVar85[4] = alVar4[1]._5_1_;
        auVar85[5] = 0;
        auVar85[6] = uVar80;
        auVar85[7] = 0;
        auVar85[8] = alVar4[1]._6_1_;
        auVar85[9] = 0;
        auVar85[10] = alVar3[1]._6_1_;
        auVar85[0xb] = 0;
        auVar85[0xc] = alVar4[1]._7_1_;
        auVar85[0xd] = 0;
        auVar85[0xe] = alVar3[1]._7_1_;
        auVar85[0xf] = 0;
        auVar34[0xc] = alVar3[1]._3_1_;
        auVar34[0xd] = 0;
        auVar34[0xe] = alVar2[1]._3_1_;
        auVar39[10] = alVar2[1]._2_1_;
        auVar39._0_10_ = (unkuint10)bVar79 << 0x40;
        auVar39[0xb] = 0;
        auVar39._12_3_ = auVar34._12_3_;
        auVar44._10_5_ = auVar39._10_5_;
        auVar44._0_10_ = (unkuint10)alVar3[1]._2_1_ << 0x40;
        auVar46._8_7_ = auVar44._8_7_;
        auVar46._0_8_ = (ulong)alVar2[1]._1_1_ << 0x30;
        auVar48._6_9_ = auVar46._6_9_;
        auVar48._0_6_ = (uint6)alVar3[1]._1_1_ << 0x20;
        auVar92[2] = (char)alVar2[1];
        auVar92[3] = 0;
        auVar92._4_11_ = auVar48._4_11_;
        auVar92[0xf] = 0;
        auVar81[2] = alVar2[1]._4_1_;
        auVar81[3] = 0;
        auVar81[4] = uVar80;
        auVar81[5] = 0;
        auVar81[6] = alVar2[1]._5_1_;
        auVar81[7] = 0;
        auVar81[8] = alVar3[1]._6_1_;
        auVar81[9] = 0;
        auVar81[10] = alVar2[1]._6_1_;
        auVar81[0xb] = 0;
        auVar81[0xc] = alVar3[1]._7_1_;
        auVar81[0xd] = 0;
        auVar81[0xe] = alVar2[1]._7_1_;
        auVar81[0xf] = 0;
        auVar88 = pmaddwd(auVar90,auVar69);
        auVar95 = pmaddwd(auVar85,auVar69);
        auVar99 = pmaddwd(auVar92,auVar70);
        auVar81 = pmaddwd(auVar81,auVar70);
        auVar93._0_4_ = auVar99._0_4_ + auVar88._0_4_ + 0x108000 >> 0x10;
        auVar93._4_4_ = auVar99._4_4_ + auVar88._4_4_ + 0x108000 >> 0x10;
        auVar93._8_4_ = auVar99._8_4_ + auVar88._8_4_ + 0x108000 >> 0x10;
        auVar93._12_4_ = auVar99._12_4_ + auVar88._12_4_ + 0x108000 >> 0x10;
        auVar88._0_4_ = auVar81._0_4_ + auVar95._0_4_ + 0x108000 >> 0x10;
        auVar88._4_4_ = auVar81._4_4_ + auVar95._4_4_ + 0x108000 >> 0x10;
        auVar88._8_4_ = auVar81._8_4_ + auVar95._8_4_ + 0x108000 >> 0x10;
        auVar88._12_4_ = auVar81._12_4_ + auVar95._12_4_ + 0x108000 >> 0x10;
        auVar81 = packssdw(auVar93,auVar88);
        sVar5 = auVar83._0_2_;
        sVar6 = auVar83._2_2_;
        sVar7 = auVar83._4_2_;
        sVar8 = auVar83._6_2_;
        sVar9 = auVar83._8_2_;
        sVar10 = auVar83._10_2_;
        sVar11 = auVar83._12_2_;
        sVar12 = auVar83._14_2_;
        sVar13 = auVar81._0_2_;
        sVar14 = auVar81._2_2_;
        sVar15 = auVar81._4_2_;
        sVar16 = auVar81._6_2_;
        sVar17 = auVar81._8_2_;
        sVar18 = auVar81._10_2_;
        sVar19 = auVar81._12_2_;
        sVar20 = auVar81._14_2_;
        puVar1 = y + uVar74;
        *puVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar83[0] - (0xff < sVar5);
        puVar1[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar83[2] - (0xff < sVar6);
        puVar1[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar83[4] - (0xff < sVar7);
        puVar1[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar83[6] - (0xff < sVar8);
        puVar1[4] = (0 < sVar9) * (sVar9 < 0x100) * auVar83[8] - (0xff < sVar9);
        puVar1[5] = (0 < sVar10) * (sVar10 < 0x100) * auVar83[10] - (0xff < sVar10);
        puVar1[6] = (0 < sVar11) * (sVar11 < 0x100) * auVar83[0xc] - (0xff < sVar11);
        puVar1[7] = (0 < sVar12) * (sVar12 < 0x100) * auVar83[0xe] - (0xff < sVar12);
        puVar1[8] = (0 < sVar13) * (sVar13 < 0x100) * auVar81[0] - (0xff < sVar13);
        puVar1[9] = (0 < sVar14) * (sVar14 < 0x100) * auVar81[2] - (0xff < sVar14);
        puVar1[10] = (0 < sVar15) * (sVar15 < 0x100) * auVar81[4] - (0xff < sVar15);
        puVar1[0xb] = (0 < sVar16) * (sVar16 < 0x100) * auVar81[6] - (0xff < sVar16);
        puVar1[0xc] = (0 < sVar17) * (sVar17 < 0x100) * auVar81[8] - (0xff < sVar17);
        puVar1[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar81[10] - (0xff < sVar18);
        puVar1[0xe] = (0 < sVar19) * (sVar19 < 0x100) * auVar81[0xc] - (0xff < sVar19);
        puVar1[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar81[0xe] - (0xff < sVar20);
        uVar74 = uVar74 + 0x10;
        uVar75 = (int)uVar76 + 0x10;
        uVar76 = (ulong)uVar75;
        lVar72 = 1;
        palVar78 = bgr_plane;
        bVar71 = false;
      } while (bVar77);
      bgr = bgr + 0x60;
    } while ((int)uVar75 < (int)(width & 0xffffffe0U));
  }
  if ((int)uVar75 < width) {
    lVar72 = (long)(int)uVar75;
    pbVar73 = bgr + 2;
    do {
      y[lVar72] = (uint8_t)((uint)pbVar73[-2] * 0x1914 +
                            (uint)pbVar73[-1] * 0x8123 + (uint)*pbVar73 * 0x41c7 + 0x108000 >> 0x10)
      ;
      lVar72 = lVar72 + 1;
      pbVar73 = pbVar73 + 3;
    } while (width != lVar72);
  }
  return;
}

Assistant:

static void ConvertBGR24ToY_SSE2(const uint8_t* bgr, uint8_t* y, int width) {
  const int max_width = width & ~31;
  int i;
  for (i = 0; i < max_width; bgr += 3 * 16 * 2) {
    __m128i bgr_plane[6];
    int j;

    RGB24PackedToPlanar_SSE2(bgr, bgr_plane);

    for (j = 0; j < 2; ++j, i += 16) {
      const __m128i zero = _mm_setzero_si128();
      __m128i r, g, b, Y0, Y1;

      // Convert to 16-bit Y.
      b = _mm_unpacklo_epi8(bgr_plane[0 + j], zero);
      g = _mm_unpacklo_epi8(bgr_plane[2 + j], zero);
      r = _mm_unpacklo_epi8(bgr_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y0);

      // Convert to 16-bit Y.
      b = _mm_unpackhi_epi8(bgr_plane[0 + j], zero);
      g = _mm_unpackhi_epi8(bgr_plane[2 + j], zero);
      r = _mm_unpackhi_epi8(bgr_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y1);

      // Cast to 8-bit and store.
      STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
    }
  }
  for (; i < width; ++i, bgr += 3) {  // left-over
    y[i] = VP8RGBToY(bgr[2], bgr[1], bgr[0], YUV_HALF);
  }
}